

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int buffer_size;
  void *void_buffer;
  uint local_3c;
  uint8_t *local_38 [3];
  
  if ((int)this->buffer_end_ != (int)this->buffer_) {
    Refresh();
LAB_00f8f0cc:
    Refresh();
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    pZVar1 = this->input_;
    do {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,local_38,&local_3c);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        this->buffer_ = (uint8_t *)0x0;
        this->buffer_end_ = (uint8_t *)0x0;
        return false;
      }
    } while ((long)(int)local_3c == 0);
    this->buffer_ = local_38[0];
    local_38[0] = local_38[0] + (int)local_3c;
    this->buffer_end_ = local_38[0];
    if ((int)local_3c < 0) goto LAB_00f8f0cc;
    iVar3 = this->total_bytes_read_;
    iVar5 = iVar3 - (local_3c ^ 0x7fffffff);
    if (iVar5 == 0 || iVar3 < (int)(local_3c ^ 0x7fffffff)) {
      iVar3 = local_3c + iVar3;
    }
    else {
      this->overflow_bytes_ = iVar5;
      local_38[0] = local_38[0] + -(long)iVar5;
      iVar3 = 0x7fffffff;
    }
    this->total_bytes_read_ = iVar3;
    this->buffer_end_ = local_38[0] + this->buffer_size_after_limit_;
    iVar5 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar5 = this->total_bytes_limit_;
    }
    iVar6 = iVar3 - iVar5;
    iVar4 = 0;
    if (iVar6 != 0 && iVar5 <= iVar3) {
      this->buffer_end_ = local_38[0] + this->buffer_size_after_limit_ + -(long)iVar6;
      iVar4 = iVar6;
    }
    this->buffer_size_after_limit_ = iVar4;
  }
  else {
    cVar2 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar2 = '\0';
    }
  }
  return (bool)cVar2;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = nullptr;
    buffer_end_ = nullptr;
    return false;
  }
}